

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O0

void __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
MyersDiff(MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *original_text,
         basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *changed_text)

{
  Range local_68 [2];
  Range local_48;
  Diffs local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *changed_text_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *original_text_local;
  MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->Diff_Timeout = 1000;
  this->Diff_EditCost = 4;
  this->Match_Threshold = 0.5;
  this->Match_Distance = 1000;
  this->Patch_DeleteThreshold = 0.5;
  this->Patch_Margin = 4;
  this->text1 = original_text;
  this->text2 = changed_text;
  local_20 = changed_text;
  changed_text_local = original_text;
  original_text_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::
  vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::vector(&this->result);
  Range::Range(&local_48,this->text1);
  Range::Range(local_68,this->text2);
  diff_main(&local_38,this,local_48,local_68[0]);
  std::
  vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::operator=(&this->result,&local_38);
  std::
  vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::~vector(&local_38);
  return;
}

Assistant:

MyersDiff(const String& original_text, const String& changed_text)
        : text1{original_text}, text2{changed_text} {
        result = diff_main(Range{text1}, Range{text2});
    }